

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

bool __thiscall flatbuffers::csharp::CSharpGenerator::generate(CSharpGenerator *this)

{
  EnumDef *enum_def_00;
  StructDef *struct_def_00;
  Parser *pPVar1;
  bool bVar2;
  reference ppEVar3;
  reference ppSVar4;
  StructDef *struct_def;
  string declcode;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_88;
  const_iterator it_1;
  EnumDef *enum_def;
  string enumcode;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_40;
  const_iterator it;
  string one_file_code;
  CSharpGenerator *this_local;
  
  std::__cxx11::string::string((string *)&it);
  this->cur_name_space_ = ((this->super_BaseGenerator).parser_)->current_namespace_;
  local_40._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->enums_).vec);
  while( true ) {
    enumcode.field_2._8_8_ =
         std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                   (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)((long)&enumcode.field_2 + 8));
    if (!bVar2) break;
    std::__cxx11::string::string((string *)&enum_def);
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_40);
    enum_def_00 = *ppEVar3;
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      this->cur_name_space_ = (enum_def_00->super_Definition).defined_namespace;
    }
    GenEnum(this,enum_def_00,(string *)&enum_def,&((this->super_BaseGenerator).parser_)->opts);
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      bVar2 = SaveType(this,(string *)enum_def_00,(enum_def_00->super_Definition).defined_namespace,
                       (string *)&enum_def,false,&((this->super_BaseGenerator).parser_)->opts);
      if (bVar2) goto LAB_0021893e;
      this_local._7_1_ = 0;
      it_1._M_current._0_4_ = 1;
    }
    else {
      std::__cxx11::string::operator+=((string *)&it,(string *)&enum_def);
LAB_0021893e:
      it_1._M_current._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&enum_def);
    if ((int)it_1._M_current != 0) goto LAB_00218b99;
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_40);
  }
  local_88._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    declcode.field_2._8_8_ =
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                   (&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)((long)&declcode.field_2 + 8));
    if (!bVar2) break;
    std::__cxx11::string::string((string *)&struct_def);
    ppSVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_88);
    struct_def_00 = *ppSVar4;
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      this->cur_name_space_ = (struct_def_00->super_Definition).defined_namespace;
    }
    GenStruct(this,struct_def_00,(string *)&struct_def,&((this->super_BaseGenerator).parser_)->opts)
    ;
    GenStructVerifier(this,struct_def_00,(string *)&struct_def);
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      bVar2 = SaveType(this,(string *)struct_def_00,
                       (struct_def_00->super_Definition).defined_namespace,(string *)&struct_def,
                       true,&((this->super_BaseGenerator).parser_)->opts);
      if (bVar2) goto LAB_00218af4;
      this_local._7_1_ = 0;
      it_1._M_current._0_4_ = 1;
    }
    else {
      std::__cxx11::string::operator+=((string *)&it,(string *)&struct_def);
LAB_00218af4:
      it_1._M_current._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&struct_def);
    if ((int)it_1._M_current != 0) goto LAB_00218b99;
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_88);
  }
  if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
    this_local._7_1_ = 1;
    it_1._M_current._0_4_ = 1;
  }
  else {
    pPVar1 = (this->super_BaseGenerator).parser_;
    this_local._7_1_ =
         SaveType(this,(this->super_BaseGenerator).file_name_,pPVar1->current_namespace_,
                  (string *)&it,true,&pPVar1->opts);
    it_1._M_current._0_4_ = 1;
  }
LAB_00218b99:
  std::__cxx11::string::~string((string *)&it);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generate() {
    std::string one_file_code;
    cur_name_space_ = parser_.current_namespace_;

    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      std::string enumcode;
      auto &enum_def = **it;
      if (!parser_.opts.one_file) cur_name_space_ = enum_def.defined_namespace;
      GenEnum(enum_def, &enumcode, parser_.opts);
      if (parser_.opts.one_file) {
        one_file_code += enumcode;
      } else {
        if (!SaveType(enum_def.name, *enum_def.defined_namespace, enumcode,
                      false, parser_.opts))
          return false;
      }
    }

    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      std::string declcode;
      auto &struct_def = **it;
      if (!parser_.opts.one_file)
        cur_name_space_ = struct_def.defined_namespace;
      GenStruct(struct_def, &declcode, parser_.opts);
      GenStructVerifier(struct_def, &declcode);
      if (parser_.opts.one_file) {
        one_file_code += declcode;
      } else {
        if (!SaveType(struct_def.name, *struct_def.defined_namespace, declcode,
                      true, parser_.opts))
          return false;
      }
    }

    if (parser_.opts.one_file) {
      return SaveType(file_name_, *parser_.current_namespace_, one_file_code,
                      true, parser_.opts);
    }
    return true;
  }